

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimerManager.cpp
# Opt level: O0

void __thiscall TimerManager::addTimer(TimerManager *this,Timer *timer)

{
  uint uVar1;
  Timer **ppTVar2;
  uint local_34;
  undefined1 local_30 [4];
  uint i;
  AutoLock l;
  Timer *timer_local;
  TimerManager *this_local;
  
  l._16_8_ = timer;
  AutoLock::AutoLock((AutoLock *)local_30,&this->mMutex);
  for (local_34 = 0; uVar1 = JetHead::vector<Timer_*>::size(&this->mTimers), local_34 < uVar1;
      local_34 = local_34 + 1) {
    ppTVar2 = JetHead::vector<Timer_*>::operator[](&this->mTimers,local_34);
    if (*ppTVar2 == (Timer *)l._16_8_) goto LAB_00133e88;
  }
  JetHead::vector<Timer_*>::push_back(&this->mTimers,(Timer **)&l.mLine);
LAB_00133e88:
  AutoLock::~AutoLock((AutoLock *)local_30);
  return;
}

Assistant:

void TimerManager::addTimer(Timer* timer)
{
	TRACE_BEGIN(LOG_LVL_NOISE);
	
	// Lock mutex while accessing/modifying mTimers vector
	AutoLock l(mMutex);
	
	// Search the vector of timers to see if the specified
	// timer is already present.   If it is then return
	// immediately.
	for (unsigned i = 0; i < mTimers.size(); ++i)
	{
		if (mTimers[i] == timer)
		{
			// Timer already in our vector so nothing to do
			return;
		}
	}
	
	mTimers.push_back(timer);
}